

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmath.hpp
# Opt level: O0

unsigned_long
(anonymous_namespace)::inBetween<int,unsigned_long,int>(int min,unsigned_long x,int max)

{
  int max_local;
  unsigned_long x_local;
  int min_local;
  unsigned_long local_8;
  
  if (x < (ulong)(long)min) {
    local_8 = (unsigned_long)min;
  }
  else {
    local_8 = x;
    if ((ulong)(long)max < x) {
      local_8 = (unsigned_long)max;
    }
  }
  return local_8;
}

Assistant:

inline B inBetween(A min, B x, C max)
{
  using T = typename std::common_type<A, B, C>::type;

  if ((T) x < (T) min)
    return (B) min;
  if ((T) x > (T) max)
    return (B) max;

  return x;
}